

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O1

void opengv::generateRandom2D2DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,translations_t *camOffsets,rotations_t *camRotations,
               size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *bearingVectors1,bearingVectors_t *bearingVectors2,
               vector<int,_std::allocator<int>_> *camCorrespondences1,
               vector<int,_std::allocator<int>_> *camCorrespondences2,MatrixXd *gt)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  double dVar3;
  double *pdVar4;
  pointer pMVar5;
  pointer pMVar6;
  iterator iVar7;
  pointer pMVar8;
  iterator iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  MatrixXd *pMVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  translation_t *ptVar21;
  rotations_t *prVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  double dVar32;
  double dVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM7 [16];
  rotation_t camRotation_1;
  rotation_t camRotation;
  undefined1 local_1f8 [8];
  double *pdStack_1f0;
  double local_1e8;
  rotation_t *local_1e0;
  double *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  variable_if_dynamic<long,__1> vStack_1b8;
  double dStack_1b0;
  MatrixXd *pMStack_1a8;
  variable_if_dynamic<long,__1> vStack_1a0;
  double dStack_198;
  double dStack_190;
  translation_t *local_188;
  undefined1 *local_178;
  double dStack_170;
  double dStack_168;
  double dStack_160;
  undefined1 *puStack_158;
  double *pdStack_150;
  double dStack_148;
  double dStack_140;
  double local_138;
  translation_t *local_130;
  rotations_t *local_128;
  rotation_t *local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  ulong local_f0;
  translation_t *local_e8;
  rotation_t *local_e0;
  double local_d8;
  double local_d0;
  undefined1 local_c8 [16];
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  Vector3d local_68;
  Vector3d local_48;
  
  local_130 = position2;
  local_128 = camRotations;
  local_120 = rotation2;
  local_f8 = outlierFraction;
  local_e8 = position1;
  local_e0 = rotation1;
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    lVar28 = 0;
    uVar31 = 0;
    do {
      generateRandomPoint((Vector3d *)local_1c8,8.0,4.0);
      pdVar4 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar29 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      uVar25 = uVar29;
      if ((((ulong)(pdVar4 + uVar29 * uVar31) & 7) == 0) &&
         (uVar25 = (ulong)(-((uint)((ulong)(pdVar4 + uVar29 * uVar31) >> 3) & 0x1fffffff) & 7),
         (long)uVar29 <= (long)uVar25)) {
        uVar25 = uVar29;
      }
      uVar26 = uVar29 - uVar25;
      uVar23 = uVar26 + 7;
      if (-1 < (long)uVar26) {
        uVar23 = uVar26;
      }
      if (0 < (long)uVar25) {
        uVar27 = 0;
        do {
          *(undefined8 *)((long)pdVar4 + uVar27 * 8 + uVar29 * lVar28) =
               *(undefined8 *)(local_1c8 + uVar27 * 8);
          uVar27 = uVar27 + 1;
        } while (uVar25 != uVar27);
      }
      uVar23 = (uVar23 & 0xfffffffffffffff8) + uVar25;
      if (7 < (long)uVar26) {
        do {
          uVar12 = *(undefined8 *)(local_1c8 + uVar25 * 8 + 8);
          lVar24 = (&vStack_1b8)[uVar25].m_value;
          dVar3 = (&dStack_1b0)[uVar25];
          pMVar13 = (&pMStack_1a8)[uVar25];
          lVar14 = (&vStack_1a0)[uVar25].m_value;
          lVar15 = (&vStack_1a0)[uVar25 + 1].m_value;
          dVar32 = (&dStack_190)[uVar25];
          puVar2 = (undefined8 *)((long)pdVar4 + uVar25 * 8 + uVar29 * lVar28);
          *puVar2 = *(undefined8 *)(local_1c8 + uVar25 * 8);
          puVar2[1] = uVar12;
          puVar2[2] = lVar24;
          puVar2[3] = dVar3;
          puVar2[4] = pMVar13;
          puVar2[5] = lVar14;
          puVar2[6] = lVar15;
          puVar2[7] = dVar32;
          uVar25 = uVar25 + 8;
        } while ((long)uVar25 < (long)uVar23);
      }
      if ((long)uVar23 < (long)uVar29) {
        do {
          *(undefined8 *)((long)pdVar4 + uVar23 * 8 + uVar29 * lVar28) =
               *(undefined8 *)(local_1c8 + uVar23 * 8);
          uVar23 = uVar23 + 1;
        } while (uVar29 != uVar23);
      }
      uVar31 = uVar31 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar31 < (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols);
  }
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols == 0)
  {
    uVar31 = 0;
  }
  else {
    local_f0 = ((long)(camOffsets->
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(camOffsets->
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1;
    lVar28 = 0;
    uVar29 = 0;
    uVar31 = 0;
    do {
      pMVar5 = (camOffsets->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pMVar8 = pMVar5 + uVar31;
      local_108 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0];
      dStack_100 = *(double *)
                    ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage.m_data + 8);
      local_118 = *(double *)
                   ((long)&pMVar5[uVar31].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data + 0x10);
      pMVar6 = (local_128->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_138 = *(double *)
                   ((long)&pMVar6[uVar31].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data + 0x40);
      pMVar6 = pMVar6 + uVar31;
      local_178 = *(undefined1 **)
                   &(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                    .m_data;
      dStack_170 = *(double *)
                    ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 8);
      dStack_168 = *(double *)
                    ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x10);
      dStack_160 = *(double *)
                    ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x18);
      puStack_158 = *(undefined1 **)
                     ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data + 0x20);
      pdStack_150 = *(double **)
                     ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data + 0x28);
      dStack_148 = *(double *)
                    ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x30);
      dStack_140 = *(double *)
                    ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x38);
      vStack_1b8.m_value =
           (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      local_1c8._8_8_ =
           (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
           vStack_1b8.m_value * uVar29;
      local_1c8._0_8_ = local_e0;
      pMStack_1a8 = gt;
      vStack_1a0.m_value = 0;
      local_188 = local_e8;
      local_1f8 = (undefined1  [8])local_e0;
      dStack_198 = (double)uVar29;
      dStack_190 = (double)vStack_1b8.m_value;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&pdStack_1f0,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)(local_1c8 + 8));
      local_1e0 = (rotation_t *)local_1f8;
      local_1d8 = pdStack_1f0;
      local_1d0 = 3;
      dVar32 = *pdStack_1f0;
      dVar35 = pdStack_1f0[1];
      dVar3 = pdStack_1f0[2];
      auVar41._8_8_ = 0;
      auVar41._0_8_ =
           (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage).m_data
           .array[2];
      auVar10 = vmovhpd_avx(auVar41,(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                     local_1f8)->m_storage).m_data.array[5]);
      local_78 = dVar32 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->
                          m_storage).m_data.array[0] +
                 dVar35 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->
                          m_storage).m_data.array[1] + dVar3 * auVar10._0_8_;
      dStack_70 = dVar32 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->
                           m_storage).m_data.array[3] +
                  dVar35 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->
                           m_storage).m_data.array[4] + dVar3 * auVar10._8_8_;
      local_d0 = dVar3 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->
                         m_storage).m_data.array[8] +
                 dVar32 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->
                          m_storage).m_data.array[6] +
                 dVar35 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->
                          m_storage).m_data.array[7];
      free((void *)pdStack_1f0[-1]);
      vStack_1b8.m_value =
           (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      local_1c8._8_8_ =
           (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
           vStack_1b8.m_value * uVar29;
      local_1c8._0_8_ = local_120;
      pMStack_1a8 = gt;
      vStack_1a0.m_value = 0;
      local_188 = local_130;
      local_1f8 = (undefined1  [8])local_120;
      dStack_198 = (double)uVar29;
      dStack_190 = (double)vStack_1b8.m_value;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&pdStack_1f0,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)(local_1c8 + 8));
      local_1e0 = (rotation_t *)local_1f8;
      local_1d8 = pdStack_1f0;
      local_1d0 = 3;
      local_b8 = *pdStack_1f0;
      dStack_b0 = pdStack_1f0[1];
      local_88 = local_b8 *
                 (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage).
                 m_data.array[0];
      dStack_80 = dStack_b0 *
                  (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage)
                  .m_data.array[1];
      local_98 = local_b8 *
                 (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage).
                 m_data.array[3];
      dStack_90 = dStack_b0 *
                  (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage)
                  .m_data.array[4];
      local_a8 = pdStack_1f0[2];
      auVar36._8_8_ = 0;
      auVar36._0_8_ =
           (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage).m_data
           .array[2];
      local_c8 = vmovhps_avx(auVar36,(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                      local_1f8)->m_storage).m_data.array[5]);
      local_b8 = local_b8 *
                 (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage).
                 m_data.array[6];
      dStack_b0 = dStack_b0 *
                  (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage)
                  .m_data.array[7];
      local_d8 = local_a8 *
                 (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f8)->m_storage).
                 m_data.array[8];
      dStack_a0 = local_a8;
      free((void *)pdStack_1f0[-1]);
      auVar10._8_8_ = dStack_100;
      auVar10._0_8_ = local_108;
      auVar20._8_8_ = dStack_70;
      auVar20._0_8_ = local_78;
      auVar11 = vsubpd_avx(auVar20,auVar10);
      dVar3 = local_d0 - local_118;
      dVar32 = auVar11._0_8_;
      dVar35 = auVar11._8_8_;
      auVar11._8_8_ = dStack_160;
      auVar11._0_8_ = dStack_168;
      auVar11 = vmovhpd_avx(auVar11,pdStack_150);
      local_1f8 = (undefined1  [8])
                  (dVar3 * auVar11._0_8_ + dVar32 * (double)local_178 + dVar35 * dStack_170);
      pdStack_1f0 = (double *)
                    (dVar3 * auVar11._8_8_ + dVar32 * dStack_160 + dVar35 * (double)puStack_158);
      local_1e8 = dVar3 * local_138 + dVar32 * dStack_148 + dVar35 * dStack_140;
      iVar7._M_current =
           (bearingVectors1->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (bearingVectors1->
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)bearingVectors1,iVar7,(Matrix<double,_3,_1,_0,_3,_1> *)local_1f8);
        auVar10._8_8_ = dStack_100;
        auVar10._0_8_ = local_108;
      }
      else {
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[2] = local_1e8;
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[0] = (double)local_1f8;
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[1] = (double)pdStack_1f0;
        ppMVar1 = &(bearingVectors1->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      auVar33._0_8_ = local_88 + dStack_80 + (double)local_c8._0_8_ * local_a8;
      auVar33._8_8_ = local_98 + dStack_90 + (double)local_c8._8_8_ * dStack_a0;
      auVar10 = vsubpd_avx(auVar33,auVar10);
      dVar3 = (local_b8 + dStack_b0 + local_d8) - local_118;
      dVar32 = auVar10._0_8_;
      dVar35 = auVar10._8_8_;
      auVar18._8_8_ = dStack_160;
      auVar18._0_8_ = dStack_168;
      auVar10 = vmovhpd_avx(auVar18,pdStack_150);
      local_1f8 = (undefined1  [8])
                  (dVar3 * auVar10._0_8_ + dVar32 * (double)local_178 + dVar35 * dStack_170);
      pdStack_1f0 = (double *)
                    (dVar3 * auVar10._8_8_ + dVar32 * dStack_160 + dVar35 * (double)puStack_158);
      local_1e8 = dVar3 * local_138 + dVar32 * dStack_148 + dVar35 * dStack_140;
      iVar7._M_current =
           (bearingVectors2->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (bearingVectors2->
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)bearingVectors2,iVar7,(Matrix<double,_3,_1,_0,_3,_1> *)local_1f8);
      }
      else {
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[2] = local_1e8;
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[0] = (double)local_1f8;
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[1] = (double)pdStack_1f0;
        ppMVar1 = &(bearingVectors2->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      pMVar8 = (bearingVectors1->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar10 = *(undefined1 (*) [16])
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar28);
      dVar3 = *(double *)
               ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar28 + 0x10);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar3 * dVar3 + auVar10._0_8_ * auVar10._0_8_ + auVar10._8_8_ * auVar10._8_8_;
      auVar11 = vsqrtpd_avx(auVar37);
      dVar32 = auVar11._0_8_;
      auVar42._8_8_ = dVar32;
      auVar42._0_8_ = dVar32;
      auVar10 = vdivpd_avx(auVar10,auVar42);
      *(undefined1 (*) [16])
       ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar28) = auVar10;
      *(double *)
       ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar28 + 0x10) = dVar3 / dVar32;
      pMVar8 = (bearingVectors2->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar10 = *(undefined1 (*) [16])
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar28);
      dVar3 = *(double *)
               ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar28 + 0x10);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar3 * dVar3 + auVar10._0_8_ * auVar10._0_8_ + auVar10._8_8_ * auVar10._8_8_;
      auVar11 = vsqrtpd_avx(auVar38);
      dVar32 = auVar11._0_8_;
      auVar43._8_8_ = dVar32;
      auVar43._0_8_ = dVar32;
      auVar10 = vdivpd_avx(auVar10,auVar43);
      *(undefined1 (*) [16])
       ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar28) = auVar10;
      *(double *)
       ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar28 + 0x10) = dVar3 / dVar32;
      if (0.0 < noise) {
        pMVar8 = (bearingVectors1->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = *(double *)
               ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar28 + 0x10);
        pdVar4 = (double *)
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar28);
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = *pdVar4;
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = pdVar4[1];
        addNoise((Vector3d *)local_1c8,noise,&local_48);
        pMVar8 = (bearingVectors1->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar28 + 0x10) = vStack_1b8.m_value;
        puVar2 = (undefined8 *)
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar28);
        *puVar2 = local_1c8._0_8_;
        puVar2[1] = local_1c8._8_8_;
        pMVar8 = (bearingVectors2->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = *(double *)
               ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar28 + 0x10);
        pdVar4 = (double *)
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar28);
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = *pdVar4;
        local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = pdVar4[1];
        addNoise((Vector3d *)local_1c8,noise,&local_68);
        pMVar8 = (bearingVectors2->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar28 + 0x10) = vStack_1b8.m_value;
        puVar2 = (undefined8 *)
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar28);
        *puVar2 = local_1c8._0_8_;
        puVar2[1] = local_1c8._8_8_;
      }
      iVar30 = (int)uVar31;
      iVar9._M_current =
           (camCorrespondences1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (camCorrespondences1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_1c8._0_4_ = iVar30;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (camCorrespondences1,iVar9,(int *)local_1c8);
      }
      else {
        *iVar9._M_current = iVar30;
        (camCorrespondences1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      local_1c8._0_4_ = iVar30;
      iVar9._M_current =
           (camCorrespondences2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (camCorrespondences2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (camCorrespondences2,iVar9,(int *)local_1c8);
      }
      else {
        *iVar9._M_current = iVar30;
        (camCorrespondences2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      uVar25 = uVar31 + 1;
      uVar31 = 0;
      if (uVar25 <= local_f0) {
        uVar31 = uVar25;
      }
      uVar29 = uVar29 + 1;
      lVar28 = lVar28 + 0x18;
    } while (uVar29 < (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols);
  }
  prVar22 = local_128;
  ptVar21 = local_130;
  auVar10 = vcvtusi2sd_avx512f(in_XMM7,numberPoints);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar10._0_8_ * local_f8;
  auVar10 = vroundsd_avx(auVar34,auVar34,9);
  lVar28 = vcvttsd2usi_avx512f(auVar10);
  if (lVar28 != 0) {
    lVar24 = 0x10;
    do {
      pMVar5 = (camOffsets->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pMVar8 = pMVar5 + uVar31;
      local_118 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0];
      dStack_110 = *(double *)
                    ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage.m_data + 8);
      local_108 = *(double *)
                   ((long)&pMVar5[uVar31].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data + 0x10);
      pMVar6 = (prVar22->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_188 = *(translation_t **)
                   ((long)&pMVar6[uVar31].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data + 0x40);
      pMVar6 = pMVar6 + uVar31;
      local_1c8._0_8_ =
           (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
      local_1c8._8_8_ =
           *(double *)
            ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                    .m_data + 8);
      vStack_1b8.m_value =
           *(long *)((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x10);
      dStack_1b0 = *(double *)
                    ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x18);
      pMStack_1a8 = *(MatrixXd **)
                     ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data + 0x20);
      vStack_1a0.m_value =
           *(long *)((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x28);
      dStack_198 = *(double *)
                    ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x30);
      dStack_190 = *(double *)
                    ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x38);
      generateRandomPoint((Vector3d *)local_1f8,8.0,4.0);
      auVar16._8_8_ = pdStack_1f0;
      auVar16._0_8_ = local_1f8;
      auVar10 = vsubpd_avx(auVar16,*(undefined1 (*) [16])
                                    (ptVar21->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                    m_storage.m_data.array);
      dVar3 = local_1e8 -
              (ptVar21->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
      pdStack_150 = &dStack_170;
      dVar32 = auVar10._0_8_;
      dVar35 = auVar10._8_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ =
           (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
           m_data.array[2];
      auVar10 = vmovhpd_avx(auVar45,(local_120->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                    m_storage.m_data.array[5]);
      auVar40._0_8_ =
           dVar3 * auVar10._0_8_ +
           dVar32 * (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[0] +
           dVar35 * (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[1];
      auVar40._8_8_ =
           dVar3 * auVar10._8_8_ +
           dVar32 * (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[3] +
           dVar35 * (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[4];
      auVar19._8_8_ = dStack_110;
      auVar19._0_8_ = local_118;
      auVar10 = vsubpd_avx(auVar40,auVar19);
      pMVar8 = (bearingVectors2->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_178 = local_1c8;
      dStack_170 = auVar10._0_8_;
      dStack_168 = auVar10._8_8_;
      dStack_160 = (dVar3 * (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            ).m_storage.m_data.array[8] +
                   dVar32 * (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            ).m_storage.m_data.array[6] +
                   dVar35 * (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            ).m_storage.m_data.array[7]) - local_108;
      dStack_148 = 1.48219693752374e-323;
      auVar17._8_8_ = dStack_1b0;
      auVar17._0_8_ = vStack_1b8.m_value;
      auVar10 = vmovhpd_avx(auVar17,vStack_1a0.m_value);
      pdVar4 = (double *)
               ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar24 + -0x10);
      *pdVar4 = dStack_160 * auVar10._0_8_ +
                dStack_170 * (double)local_1c8._0_8_ + dStack_168 * (double)local_1c8._8_8_;
      pdVar4[1] = dStack_160 * auVar10._8_8_ +
                  dStack_170 * dStack_1b0 + dStack_168 * (double)pMStack_1a8;
      *(double *)
       ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar24) =
           dStack_160 * (double)local_188 + dStack_170 * dStack_198 + dStack_168 * dStack_190;
      pMVar8 = (bearingVectors2->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar10 = *(undefined1 (*) [16])
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar24 + -0x10);
      dVar3 = *(double *)
               ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar24);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar3 * dVar3 + auVar10._0_8_ * auVar10._0_8_ + auVar10._8_8_ * auVar10._8_8_;
      auVar11 = vsqrtpd_avx(auVar39);
      dVar32 = auVar11._0_8_;
      auVar44._8_8_ = dVar32;
      auVar44._0_8_ = dVar32;
      auVar10 = vdivpd_avx(auVar10,auVar44);
      *(undefined1 (*) [16])
       ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar24 + -0x10) = auVar10;
      *(double *)
       ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar24) = dVar3 / dVar32;
      lVar24 = lVar24 + 0x18;
      lVar28 = lVar28 + -1;
      puStack_158 = local_178;
    } while (lVar28 != 0);
  }
  return;
}

Assistant:

void
opengv::generateRandom2D2DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & bearingVectors1,
    bearingVectors_t & bearingVectors2,
    std::vector<int> & camCorrespondences1,
    std::vector<int> & camCorrespondences2,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 2D3D-correspondences by looping through the cameras
  size_t numberCams = camOffsets.size();
  size_t camCorrespondence = 0;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //get the camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //get the point in viewpoint 1
    point_t bodyPoint1 = rotation1.transpose()*(gt.col(i) - position1);

    //get the point in viewpoint 2
    point_t bodyPoint2 = rotation2.transpose()*(gt.col(i) - position2);

    //get the point in the camera in viewpoint 1
    bearingVectors1.push_back(camRotation.transpose()*(bodyPoint1 - camOffset));

    //get the point in the camera in viewpoint 2
    bearingVectors2.push_back(camRotation.transpose()*(bodyPoint2 - camOffset));

    //normalize the bearing-vectors
    bearingVectors1[i] = bearingVectors1[i] / bearingVectors1[i].norm();
    bearingVectors2[i] = bearingVectors2[i] / bearingVectors2[i].norm();

    //add noise
    if( noise > 0.0 )
    {
      bearingVectors1[i] = addNoise(noise,bearingVectors1[i]);
      bearingVectors2[i] = addNoise(noise,bearingVectors2[i]);
    }

    //push back the camera correspondences
    camCorrespondences1.push_back(camCorrespondence);
    camCorrespondences2.push_back(camCorrespondence++);
    if(camCorrespondence > (numberCams - 1) )
      camCorrespondence = 0;
  }

  //add outliers
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //get the corresponding camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //create random point
    point_t p = generateRandomPoint(8,4);

    //project this point into viewpoint 2
    point_t bodyPoint = rotation2.transpose()*(p - position2);

    //project this point into the corresponding camera in viewpoint 2
    //and use as outlier
    bearingVectors2[i] = camRotation.transpose()*(bodyPoint - camOffset);

    //normalize the bearing vector
    bearingVectors2[i] = bearingVectors2[i] / bearingVectors2[i].norm();
  }
}